

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dual_Resampler.cpp
# Opt level: O0

void __thiscall Dual_Resampler::Dual_Resampler(Dual_Resampler *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Dual_Resampler_00a11c18;
  blargg_vector<short>::blargg_vector((blargg_vector<short> *)(in_RDI + 1));
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 4) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  Fir_Resampler<12>::Fir_Resampler((Fir_Resampler<12> *)0x80fb84);
  return;
}

Assistant:

Dual_Resampler::Dual_Resampler() :
	sample_buf_size(0),
	oversamples_per_frame(-1),
	buf_pos(-1),
	resampler_size(0)
{
}